

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

double __thiscall ON_PolyCurve::SegmentCurveParameter(ON_PolyCurve *this,double polycurve_parameter)

{
  bool bVar1;
  int segment_index_00;
  ON_Curve *pOVar2;
  double x;
  double s;
  ON_Interval sdom;
  ON_Interval cdom;
  ON_Curve *segment_curve;
  int segment_index;
  double polycurve_parameter_local;
  ON_PolyCurve *this_local;
  
  segment_index_00 = SegmentIndex(this,polycurve_parameter);
  pOVar2 = SegmentCurve(this,segment_index_00);
  if (pOVar2 == (ON_Curve *)0x0) {
    this_local = (ON_PolyCurve *)0xffe5f8bd9e331dd2;
  }
  else {
    (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    _s = SegmentDomain(this,segment_index_00);
    bVar1 = ON_Interval::operator==((ON_Interval *)(sdom.m_t + 1),(ON_Interval *)&s);
    this_local = (ON_PolyCurve *)polycurve_parameter;
    if (!bVar1) {
      x = ON_Interval::NormalizedParameterAt((ON_Interval *)&s,polycurve_parameter);
      this_local = (ON_PolyCurve *)ON_Interval::ParameterAt((ON_Interval *)(sdom.m_t + 1),x);
    }
  }
  return (double)this_local;
}

Assistant:

double ON_PolyCurve::SegmentCurveParameter(
  double polycurve_parameter
  ) const
{
  int segment_index = SegmentIndex( polycurve_parameter );
  const ON_Curve* segment_curve = SegmentCurve(segment_index);
  if ( !segment_curve )
    return ON_UNSET_VALUE;
  ON_Interval cdom = segment_curve->Domain();
  ON_Interval sdom = SegmentDomain(segment_index);
  if ( cdom == sdom )
    return polycurve_parameter;
  double s = sdom.NormalizedParameterAt(polycurve_parameter);
  return cdom.ParameterAt(s);
}